

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

void * hugeOpen(char *URI)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  if (URI != (char *)0x0) {
    pcVar3 = "test/recurse/huge.xml";
    lVar4 = 0;
    do {
      iVar1 = strcmp(URI,pcVar3);
      if (iVar1 == 0) {
        hugeDocParts = (xmlHugeDocParts *)((long)&hugeDocTable[0].URL + lVar4);
        curseg = 0;
        pcVar3 = *(char **)((long)&hugeDocTable[0].start + lVar4);
        current = pcVar3;
        sVar2 = strlen(pcVar3);
        rlen = (int)sVar2;
        return pcVar3;
      }
      pcVar3 = *(char **)((long)&hugeDocTable[1].URL + lVar4);
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x40);
  }
  return (void *)0x0;
}

Assistant:

static void *
hugeOpen(const char * URI) {
    int i;

    if (URI == NULL)
        return(NULL);

    for (i = 0; hugeDocTable[i].URL; i++) {
        if (strcmp(URI, hugeDocTable[i].URL) == 0) {
            hugeDocParts = hugeDocTable + i;
            curseg = 0;
            current = hugeDocParts->start;
            rlen = strlen(current);
            return((void *) current);
        }
    }

    return(NULL);
}